

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::BasicAtomicCase3VSFS::Run(BasicAtomicCase3VSFS *this)

{
  CallLogWrapper *this_00;
  undefined8 *puVar1;
  uint uVar2;
  bool bVar3;
  GLuint GVar4;
  void *pvVar5;
  long lVar6;
  uint *puVar7;
  long lVar8;
  float data [8];
  string local_68;
  string local_40;
  
  bVar3 = ShaderStorageBufferObjectBase::IsVSFSAvailable
                    (&this->super_ShaderStorageBufferObjectBase,1,1);
  lVar8 = 0x10;
  if (bVar3) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "\nlayout(location = 0) in vec4 g_in_position;\nlayout(std430, binding = 0) coherent buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_vs_buffer;\nflat out int vertexid;\nvoid main() {\n  vertexid = gl_VertexID;\n  gl_Position = g_in_position;\n#ifdef GL_ES\n  gl_PointSize = 1.0f;\n#endif\n  atomicAdd(g_vs_buffer.u[0].x, g_vs_buffer.u[gl_VertexID][1]);\n  atomicAdd(g_vs_buffer.u[0][0], g_vs_buffer.u[gl_VertexID].z);\n  atomicAdd(g_vs_buffer.i[0].x, g_vs_buffer.i[gl_VertexID][1]);\n  atomicAdd(g_vs_buffer.i[0][0], g_vs_buffer.i[gl_VertexID].z);\n}"
               ,"");
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "\nlayout(location = 0) out vec4 g_fs_out;\nlayout(std430, binding = 0) coherent buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_fs_buffer;\nflat in int vertexid;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n  atomicAdd(g_fs_buffer.u[0].x, g_fs_buffer.u[vertexid][1]);\n  atomicAdd(g_fs_buffer.i[0].x, g_fs_buffer.i[vertexid][1]);\n}"
               ,"");
    GVar4 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_68,&local_40);
    this->m_program = GVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar8 = -1;
    if (bVar3) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x80,(void *)0x0,0x88e8);
      pvVar5 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x80,2);
      if (pvVar5 != (void *)0x0) {
        lVar6 = 0;
        do {
          *(undefined8 *)((long)pvVar5 + lVar6) = 0x100000000;
          ((undefined8 *)((long)pvVar5 + lVar6))[1] = 2;
          puVar1 = (undefined8 *)((long)pvVar5 + lVar6 + 0x10);
          *puVar1 = 0x100000000;
          puVar1[1] = 2;
          lVar6 = lVar6 + 0x20;
        } while (lVar6 != 0x80);
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        if (pvVar5 != (void *)0x0) {
          local_68.field_2._M_allocated_capacity = 0x3f4ccccdbf4ccccd;
          local_68.field_2._8_8_ = 0x3f4ccccd3f4ccccd;
          local_68._M_dataplus._M_p = (pointer)0xbf4ccccdbf4ccccd;
          local_68._M_string_length = 0xbf4ccccd3f4ccccd;
          glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
          glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
          glu::CallLogWrapper::glBufferData(this_00,0x8892,0x20,&local_68,0x88e4);
          glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
          glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
          glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
          glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
          glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
          glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
          glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
          glu::CallLogWrapper::glBindVertexArray(this_00,0);
          glu::CallLogWrapper::glClear(this_00,0x4000);
          glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
          glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
          glu::CallLogWrapper::glDrawArrays(this_00,0,0,4);
          glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
          puVar7 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,4,1);
          if (puVar7 != (uint *)0x0) {
            uVar2 = *puVar7;
            if (uVar2 == 0x10) {
              glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
              puVar7 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0x40,4,1);
              if (puVar7 == (uint *)0x0) {
                return -1;
              }
              uVar2 = *puVar7;
              if (uVar2 == 0x10) {
                glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
                return 0;
              }
            }
            anon_unknown_0::Output("Data at offset 0 is %d should be %d.\n",(ulong)uVar2,0x10);
          }
        }
      }
    }
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(1, 1))
			return NOT_SUPPORTED;

		const char* const glsl_vs = NL
			"layout(location = 0) in vec4 g_in_position;" NL "layout(std430, binding = 0) coherent buffer Buffer {" NL
			"  uvec4 u[4];" NL "  ivec3 i[4];" NL "} g_vs_buffer;" NL "flat out int vertexid;" NL "void main() {" NL
			"  vertexid = gl_VertexID;" NL "  gl_Position = g_in_position;" NL "#ifdef GL_ES" NL
			"  gl_PointSize = 1.0f;" NL "#endif" NL "  atomicAdd(g_vs_buffer.u[0].x, g_vs_buffer.u[gl_VertexID][1]);" NL
			"  atomicAdd(g_vs_buffer.u[0][0], g_vs_buffer.u[gl_VertexID].z);" NL
			"  atomicAdd(g_vs_buffer.i[0].x, g_vs_buffer.i[gl_VertexID][1]);" NL
			"  atomicAdd(g_vs_buffer.i[0][0], g_vs_buffer.i[gl_VertexID].z);" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "layout(std430, binding = 0) coherent buffer Buffer {" NL
			   "  uvec4 u[4];" NL "  ivec3 i[4];" NL "} g_fs_buffer;" NL "flat in int vertexid;" NL "void main() {" NL
			   "  g_fs_out = vec4(0, 1, 0, 1);" NL "  atomicAdd(g_fs_buffer.u[0].x, g_fs_buffer.u[vertexid][1]);" NL
			   "  atomicAdd(g_fs_buffer.i[0].x, g_fs_buffer.i[vertexid][1]);" NL "}";
		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* init storage buffer */
		{
			glGenBuffers(1, &m_storage_buffer);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, 8 * sizeof(int) * 4, NULL, GL_DYNAMIC_DRAW);
			ivec4* ptr = reinterpret_cast<ivec4*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8 * sizeof(int) * 4, GL_MAP_WRITE_BIT));
			if (!ptr)
				return ERROR;
			for (int i = 0; i < 4; ++i)
			{
				ptr[i * 2]	 = ivec4(0, 1, 2, 0);
				ptr[i * 2 + 1] = ivec4(0, 1, 2, 0);
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}

		/* init vertex buffer */
		{
			const float data[] = { -0.8f, -0.8f, 0.8f, -0.8f, -0.8f, 0.8f, 0.8f, 0.8f };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 4);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		GLuint* u = (GLuint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4, GL_MAP_READ_BIT);
		if (!u)
			return ERROR;
		if (*u != 16)
		{
			Output("Data at offset 0 is %d should be %d.\n", *u, 16);
			return ERROR;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLint* i = (GLint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64, 4, GL_MAP_READ_BIT);
		if (!i)
			return ERROR;
		if (*i != 16)
		{
			Output("Data at offset 0 is %d should be %d.\n", *i, 16);
			return ERROR;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		return NO_ERROR;
	}